

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

uint8_t * __thiscall
edition_unittest::TestFieldOrderings::_InternalSerialize
          (TestFieldOrderings *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  WireFormatLite *this_00;
  ulong uVar2;
  TestFieldOrderings_NestedMessage *value;
  uint8_t *puVar3;
  undefined8 *puVar4;
  EpsCopyOutputStream *pEVar5;
  string_view s;
  string_view field_name;
  
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar1 & 4) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.my_int_,target);
  }
  pEVar5 = stream;
  puVar3 = google::protobuf::internal::ExtensionSet::_InternalSerialize
                     (&(this->field_0)._impl_._extensions_,
                      (MessageLite *)_TestFieldOrderings_default_instance_,2,0xb,target,stream);
  if ((uVar1 & 1) != 0) {
    puVar4 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.my_string_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    this_00 = (WireFormatLite *)*puVar4;
    uVar2 = puVar4[1];
    field_name._M_str = (char *)pEVar5;
    field_name._M_len = (size_t)"edition_unittest.TestFieldOrderings.my_string";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (this_00,(char *)(uVar2 & 0xffffffff),1,0x2d,field_name);
    s._M_str = (char *)this_00;
    s._M_len = uVar2;
    puVar3 = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,0xb,s,puVar3)
    ;
  }
  puVar3 = google::protobuf::internal::ExtensionSet::_InternalSerialize
                     (&(this->field_0)._impl_._extensions_,
                      (MessageLite *)_TestFieldOrderings_default_instance_,0xc,0x65,puVar3,stream);
  if ((uVar1 & 8) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,puVar3);
    puVar3 = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                       (0x65,(this->field_0)._impl_.my_float_,puVar3);
  }
  if ((uVar1 & 2) != 0) {
    value = (this->field_0)._impl_.optional_nested_message_;
    puVar3 = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (200,(MessageLite *)value,*(int *)((long)&value->field_0 + 4),puVar3,stream);
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return puVar3;
  }
  puVar3 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),puVar3,stream);
  return puVar3;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestFieldOrderings::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestFieldOrderings& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestFieldOrderings)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int64 my_int = 1;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<1>(
            stream, this_._internal_my_int(), target);
  }

  // Extension range [2, 11)
  target = this_._impl_._extensions_._InternalSerialize(
      &default_instance(), 2, 11, target, stream);
  // string my_string = 11;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::absl::string_view _s = this_._internal_my_string();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestFieldOrderings.my_string");
    target = stream->WriteStringMaybeAliased(11, _s, target);
  }

  // Extension range [12, 101)
  target = this_._impl_._extensions_._InternalSerialize(
      &default_instance(), 12, 101, target, stream);
  // float my_float = 101;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFloatToArray(
        101, this_._internal_my_float(), target);
  }

  // .edition_unittest.TestFieldOrderings.NestedMessage optional_nested_message = 200;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        200, *this_._impl_.optional_nested_message_, this_._impl_.optional_nested_message_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestFieldOrderings)
  return target;
}